

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

bool __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::lexer::get_number(lexer *this,
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *result,token_type token)

{
  bool bVar1;
  number_float_t val;
  strtonum num_converter;
  number_unsigned_t local_28;
  strtonum local_20;
  
  local_20.m_start = (char *)this->m_start;
  if ((lexer_char_t *)local_20.m_start == (lexer_char_t *)0x0) {
    __assert_fail("m_start != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                  ,0x2bfd,
                  "bool nlohmann::basic_json<>::lexer::get_number(basic_json<ObjectType, ArrayType, StringType, BooleanType, NumberIntegerType, NumberUnsignedType, NumberFloatType, AllocatorType, JSONSerializer> &, const token_type) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  local_20.m_end = (char *)this->m_cursor;
  if (local_20.m_end <= local_20.m_start) {
    __assert_fail("m_start < m_cursor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                  ,0x2bfe,
                  "bool nlohmann::basic_json<>::lexer::get_number(basic_json<ObjectType, ArrayType, StringType, BooleanType, NumberIntegerType, NumberUnsignedType, NumberFloatType, AllocatorType, JSONSerializer> &, const token_type) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  if (2 < token - value_unsigned) {
    __assert_fail("(token == token_type::value_unsigned) or (token == token_type::value_integer) or (token == token_type::value_float)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                  ,0x2c01,
                  "bool nlohmann::basic_json<>::lexer::get_number(basic_json<ObjectType, ArrayType, StringType, BooleanType, NumberIntegerType, NumberUnsignedType, NumberFloatType, AllocatorType, JSONSerializer> &, const token_type) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  if (token == value_integer) {
    bVar1 = strtonum::parse<long>(&local_20,&local_28);
    if (bVar1) {
      result->m_type = number_integer;
      goto LAB_0010fe58;
    }
  }
  else if ((token == value_unsigned) &&
          (bVar1 = strtonum::parse<unsigned_long>(&local_20,&local_28), bVar1)) {
    result->m_type = number_unsigned;
LAB_0010fe58:
    (result->m_value).number_unsigned = local_28;
    return true;
  }
  bVar1 = strtonum::parse<double>(&local_20,&local_28);
  if (bVar1) {
    result->m_type = number_float;
    (result->m_value).number_unsigned = local_28;
    if (0x7fefffffffffffff < (local_28 & 0x7fffffffffffffff)) {
      result->m_type = null;
      (result->m_value).object = (object_t *)0x0;
    }
  }
  return bVar1;
}

Assistant:

bool get_number(basic_json& result, const token_type token) const
        {
            assert(m_start != nullptr);
            assert(m_start < m_cursor);
            assert((token == token_type::value_unsigned) or
                   (token == token_type::value_integer) or
                   (token == token_type::value_float));

            strtonum num_converter(reinterpret_cast<const char*>(m_start),
                                   reinterpret_cast<const char*>(m_cursor));

            switch (token)
            {
                case lexer::token_type::value_unsigned:
                {
                    number_unsigned_t val;
                    if (num_converter.to(val))
                    {
                        // parsing successful
                        result.m_type = value_t::number_unsigned;
                        result.m_value = val;
                        return true;
                    }
                    break;
                }

                case lexer::token_type::value_integer:
                {
                    number_integer_t val;
                    if (num_converter.to(val))
                    {
                        // parsing successful
                        result.m_type = value_t::number_integer;
                        result.m_value = val;
                        return true;
                    }
                    break;
                }

                default:
                {
                    break;
                }
            }

            // parse float (either explicitly or because a previous conversion
            // failed)
            number_float_t val;
            if (num_converter.to(val))
            {
                // parsing successful
                result.m_type = value_t::number_float;
                result.m_value = val;

                // replace infinity and NAN by null
                if (not std::isfinite(result.m_value.number_float))
                {
                    result.m_type  = value_t::null;
                    result.m_value = basic_json::json_value();
                }

                return true;
            }

            // couldn't parse number in any format
            return false;
        }